

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenStructArgs
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,char *nameprefix,
          size_t array_count)

{
  size_t array_count_00;
  BaseType BVar1;
  FieldDef *field;
  StructDef *pSVar2;
  EnumDef *pEVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer ppFVar7;
  string *__return_storage_ptr__;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  Type local_c8;
  long local_a8;
  size_t local_a0;
  StructDef *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a8 = array_count - 1;
  local_a0 = array_count;
  local_98 = struct_def;
  for (ppFVar7 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar7 !=
      (local_98->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar7 = ppFVar7 + 1) {
    field = *ppFVar7;
    BVar1 = (field->value).type.base_type;
    if (BVar1 == BASE_TYPE_ARRAY) {
      uVar4._0_4_ = (field->value).type.element;
      local_c8.fixed_length = (field->value).type.fixed_length;
      local_c8.element = BASE_TYPE_NONE;
      local_c8.base_type = (BaseType)uVar4;
      pSVar2 = (field->value).type.struct_def;
      pEVar3 = (field->value).type.enum_def;
      local_c8.struct_def._0_2_ = SUB82(pSVar2,0);
      local_c8.struct_def._2_6_ = (undefined6)((ulong)pSVar2 >> 0x10);
      local_c8.enum_def._0_2_ = SUB82(pEVar3,0);
      local_c8.enum_def._2_6_ = (undefined6)((ulong)pEVar3 >> 0x10);
    }
    else {
      uVar4._0_4_ = (field->value).type.base_type;
      uVar4._4_4_ = (field->value).type.element;
      uVar5 = *(undefined8 *)((long)&(field->value).type.struct_def + 2);
      uVar6 = *(undefined8 *)((long)&(field->value).type.enum_def + 2);
      local_c8.struct_def._0_2_ = SUB82((field->value).type.struct_def,0);
      local_c8.struct_def._2_6_ = (undefined6)uVar5;
      local_c8.enum_def._0_2_ = (undefined2)((ulong)uVar5 >> 0x30);
      local_c8.enum_def._2_6_ = (undefined6)uVar6;
      local_c8.fixed_length = (uint16_t)((ulong)uVar6 >> 0x30);
      local_c8._0_8_ = uVar4;
    }
    uVar8 = (ulong)(BVar1 == BASE_TYPE_ARRAY);
    array_count_00 = local_a0 + uVar8;
    if (((BaseType)uVar4 == BASE_TYPE_STRUCT) &&
       (*(char *)(CONCAT62(local_c8.struct_def._2_6_,local_c8.struct_def._0_2_) + 0x110) == '\x01'))
    {
      pSVar2 = (field->value).type.struct_def;
      EscapeKeyword(&local_70,this,(string *)field);
      std::operator+(&local_50,&local_70,"_");
      std::operator+(&local_90,nameprefix,&local_50);
      GenStructArgs(this,pSVar2,code_ptr,local_90._M_dataplus._M_p,array_count_00);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      __return_storage_ptr__ = &local_70;
    }
    else {
      std::__cxx11::string::append((char *)code_ptr);
      GenTypeBasic_abi_cxx11_(&local_90,this,&local_c8);
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_90);
      if (((field->value).type.base_type - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional))
      {
        std::__cxx11::string::append((char *)code_ptr);
      }
      __return_storage_ptr__ = &local_90;
      if (array_count_00 != 0) {
        std::__cxx11::string::append((char *)code_ptr);
        lVar9 = uVar8 + local_a8;
        while (bVar10 = lVar9 != 0, lVar9 = lVar9 + -1, bVar10) {
          std::__cxx11::string::append((char *)code_ptr);
        }
        std::__cxx11::string::append((char *)code_ptr);
      }
      std::__cxx11::string::append((char *)code_ptr);
      std::__cxx11::string::append((char *)code_ptr);
      Name_abi_cxx11_(__return_storage_ptr__,this,field);
      std::__cxx11::string::append((string *)code_ptr);
    }
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return;
}

Assistant:

void GenStructArgs(const StructDef &struct_def, std::string *code_ptr,
                     const char *nameprefix, size_t array_count = 0) const {
    std::string &code = *code_ptr;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      const auto &field_type = field.value.type;
      const auto array_field = IsArray(field_type);
      const auto &type = array_field ? field_type.VectorType() : field_type;
      const auto array_cnt = array_field ? (array_count + 1) : array_count;
      if (IsStruct(type)) {
        // Generate arguments for a struct inside a struct. To ensure names
        // don't clash, and to make it obvious these arguments are constructing
        // a nested struct, prefix the name with the field name.
        GenStructArgs(*field_type.struct_def, code_ptr,
                      (nameprefix + (EscapeKeyword(field.name) + "_")).c_str(),
                      array_cnt);
      } else {
        code += ", ";
        code += GenTypeBasic(type);
        if (field.IsScalarOptional()) { code += "?"; }
        if (array_cnt > 0) {
          code += "[";
          for (size_t i = 1; i < array_cnt; i++) code += ",";
          code += "]";
        }
        code += " ";
        code += nameprefix;
        code += Name(field);
      }
    }
  }